

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeinfo.c
# Opt level: O3

bool_t prf_nodeinfo_set(prf_nodeinfo_t *nodeinfo)

{
  char *__s;
  _func_bool_t_prf_node_t_ptr_prf_state_t_ptr_bfile_t_ptr *p_Var1;
  _func_void_prf_node_t_ptr_prf_state_t_ptr *p_Var2;
  _func_void_prf_node_t_ptr_prf_model_t_ptr *p_Var3;
  prf_nodeinfo_t **pppVar4;
  int iVar5;
  prf_nodeinfo_t *ppVar6;
  size_t sVar7;
  char *__dest;
  ushort uVar8;
  ulong uVar9;
  
  iVar5 = prf_array_count(nodetypes);
  uVar8 = nodeinfo->opcode;
  if (iVar5 <= (int)(uint)uVar8) {
    iVar5 = iVar5 + -1;
    do {
      nodetypes = (prf_nodeinfo_t **)prf_array_append_ptr(nodetypes,(void *)0x0);
      uVar8 = nodeinfo->opcode;
      iVar5 = iVar5 + 1;
    } while (iVar5 < (int)(uint)uVar8);
  }
  pppVar4 = nodetypes;
  uVar9 = (ulong)uVar8;
  if (nodetypes[uVar9] != (prf_nodeinfo_t *)0x0) {
    free(nodetypes[uVar9]->name);
    free(pppVar4[nodeinfo->opcode]);
    uVar8 = nodeinfo->opcode;
    uVar9 = (ulong)uVar8;
  }
  ppVar6 = (prf_nodeinfo_t *)malloc(0x48);
  pppVar4[uVar9] = ppVar6;
  ppVar6->opcode = uVar8;
  ppVar6->flags = nodeinfo->flags;
  p_Var1 = nodeinfo->save_f;
  ppVar6->load_f = nodeinfo->load_f;
  ppVar6->save_f = p_Var1;
  p_Var2 = nodeinfo->exit_f;
  ppVar6->entry_f = nodeinfo->entry_f;
  ppVar6->exit_f = p_Var2;
  p_Var3 = nodeinfo->destroy_f;
  ppVar6->traverse_f = nodeinfo->traverse_f;
  ppVar6->destroy_f = p_Var3;
  ppVar6->clone_f = nodeinfo->clone_f;
  __s = nodeinfo->name;
  sVar7 = strlen(__s);
  __dest = (char *)malloc(sVar7 + 1);
  ppVar6->name = __dest;
  strcpy(__dest,__s);
  return 1;
}

Assistant:

bool_t
prf_nodeinfo_set(const prf_nodeinfo_t * nodeinfo)
{
    int i;
    prf_nodeinfo_t * newnodeinfo;

    assert(nodeinfo->opcode > 0);

    i = prf_array_count(nodetypes);
    while ( i <= nodeinfo->opcode ) {
        nodetypes = (prf_nodeinfo_t **) prf_array_append_ptr(nodetypes, NULL);
        i++;
    }

    if ( nodetypes[nodeinfo->opcode ] != NULL ) {
        assert(nodetypes[nodeinfo->opcode] != nodeinfo);
        free(nodetypes[nodeinfo->opcode]->name);
        free(nodetypes[nodeinfo->opcode]);
    }

    newnodeinfo = (prf_nodeinfo_t *) malloc(sizeof(struct prf_nodeinfo_s));
    assert(newnodeinfo != NULL);
    nodetypes[ nodeinfo->opcode ] = newnodeinfo;
    newnodeinfo->opcode = nodeinfo->opcode;
    newnodeinfo->flags = nodeinfo->flags;
    newnodeinfo->load_f = nodeinfo->load_f;
    newnodeinfo->save_f = nodeinfo->save_f;
    newnodeinfo->entry_f = nodeinfo->entry_f;
    newnodeinfo->exit_f = nodeinfo->exit_f;
    newnodeinfo->traverse_f = nodeinfo->traverse_f;
    newnodeinfo->destroy_f = nodeinfo->destroy_f;
    newnodeinfo->clone_f = nodeinfo->clone_f;
    newnodeinfo->name = (char *) malloc(strlen(nodeinfo->name) + 1);
    assert(newnodeinfo->name != NULL);
    strcpy(newnodeinfo->name, nodeinfo->name);
    
    return TRUE;
}